

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleProducerConsumer3.cpp
# Opt level: O3

void __thiscall Producer::operator()(Producer *this)

{
  int iVar1;
  int *piVar2;
  pthread_t pVar3;
  ostream *this_00;
  long *plVar4;
  _Storage<int,_true> _Var5;
  undefined1 local_40 [8];
  long local_38;
  
  if (0 < this->numberOfMessages_) {
    _Var5._M_value = 0;
    do {
      local_40._0_4_ = (_Storage<int,_true>)0x1;
      local_40[4] = false;
      local_40._5_3_ = 0;
      local_38 = 0;
      do {
        iVar1 = nanosleep((timespec *)local_40,(timespec *)local_40);
        if (iVar1 != -1) break;
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Producer (id#",0xd);
      pVar3 = pthread_self();
      if (pVar3 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"thread::id of a non-executing thread",0x24);
        this_00 = (ostream *)&std::cout;
      }
      else {
        this_00 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      }
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"): ",3);
      plVar4 = (long *)std::ostream::operator<<((ostream *)this_00,_Var5._M_value);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      local_40[4] = true;
      local_40._0_4_ = _Var5._M_value;
      rtb::Concurrency::Queue<int>::push(this->outputQueue_,(optional<int> *)local_40);
      _Var5._M_value = _Var5._M_value + 1;
    } while (_Var5._M_value < this->numberOfMessages_);
  }
  local_40[4] = 0;
  rtb::Concurrency::Queue<int>::push(this->outputQueue_,(optional<int> *)local_40);
  return;
}

Assistant:

void operator()() {
        for (int i{ 0 }; i < numberOfMessages_; ++i) {
            std::this_thread::sleep_for(std::chrono::milliseconds(1000));
            cout << "Producer (id#" << std::this_thread::get_id() << "): " << i << endl;
            outputQueue_.push(i);
        }
        outputQueue_.close();
    }